

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WebAssemblyTable.cpp
# Opt level: O0

Var Js::WebAssemblyTable::EntryGet(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  CallFlags e;
  uint32 uVar3;
  ScriptContext *pSVar4;
  ThreadContext *this;
  Var *values;
  undefined4 *puVar5;
  Var pvVar6;
  WebAssemblyTable *pWVar7;
  JavascriptLibrary *pJVar8;
  WriteBarrierPtr<void> **ppWVar9;
  void **ppvVar10;
  RecyclableObject *pRStack_60;
  uint32 index;
  Var indexVar;
  WebAssemblyTable *table;
  ScriptContext *scriptContext;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar4 = RecyclableObject::GetScriptContext(function);
  this = ScriptContext::GetThreadContext(pSVar4);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(this,0xc00,pSVar4,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0x7f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  ArgumentReader::ArgumentReader
            ((ArgumentReader *)&scriptContext,(CallInfo *)&function_local,values);
  pSVar4 = RecyclableObject::GetScriptContext(function);
  e = Js::operator&((CallFlags)((ulong)function_local >> 0x18) &
                    (CallFlags_InternalFrame|CallFlags_NewTarget|CallFlags_Wrapped|CallFlags_NotUsed
                     |CallFlags_ExtraArg|CallFlags_Eval|CallFlags_Value|CallFlags_New),CallFlags_New
                   );
  bVar2 = operator!(e);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/WebAssemblyTable.cpp"
                                ,0x82,"(!(callInfo.Flags & CallFlags_New))",
                                "!(callInfo.Flags & CallFlags_New)");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (((ulong)scriptContext & 0xffffff) != 0) {
    pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
    bVar2 = VarIs<Js::WebAssemblyTable>(pvVar6);
    if (bVar2) {
      pvVar6 = Arguments::operator[]((Arguments *)&scriptContext,0);
      pWVar7 = VarTo<Js::WebAssemblyTable>(pvVar6);
      pJVar8 = ScriptContext::GetLibrary(pSVar4);
      pRStack_60 = JavascriptLibraryBase::GetUndefined(&pJVar8->super_JavascriptLibraryBase);
      if (1 < ((uint)scriptContext & 0xffffff)) {
        pRStack_60 = (RecyclableObject *)Arguments::operator[]((Arguments *)&scriptContext,1);
      }
      uVar3 = WebAssembly::ToNonWrappingUint32(pRStack_60,pSVar4);
      if (pWVar7->m_currentLength <= uVar3) {
        JavascriptError::ThrowRangeError(pSVar4,-0x7ff5ebf6,(PCWSTR)0x0);
      }
      ppWVar9 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                          ((WriteBarrierPtr *)&pWVar7->m_values);
      ppvVar10 = Memory::WriteBarrierPtr::operator_cast_to_void__
                           ((WriteBarrierPtr *)(*ppWVar9 + uVar3));
      if (*ppvVar10 == (void *)0x0) {
        pJVar8 = ScriptContext::GetLibrary(pSVar4);
        callInfo_local =
             (CallInfo)JavascriptLibraryBase::GetNull(&pJVar8->super_JavascriptLibraryBase);
      }
      else {
        ppWVar9 = Memory::WriteBarrierPtr::operator_cast_to_WriteBarrierPtr__
                            ((WriteBarrierPtr *)&pWVar7->m_values);
        ppvVar10 = Memory::WriteBarrierPtr::operator_cast_to_void__
                             ((WriteBarrierPtr *)(*ppWVar9 + uVar3));
        callInfo_local = (CallInfo)CrossSite::MarshalVar(pSVar4,*ppvVar10,false);
      }
      return (Var)callInfo_local;
    }
  }
  JavascriptError::ThrowTypeError(pSVar4,-0x7ff5e49c,(PCWSTR)0x0);
}

Assistant:

Var
WebAssemblyTable::EntryGet(RecyclableObject* function, CallInfo callInfo, ...)
{
    PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

    ARGUMENTS(args, callInfo);
    ScriptContext* scriptContext = function->GetScriptContext();

    Assert(!(callInfo.Flags & CallFlags_New));

    if (args.Info.Count == 0 || !VarIs<WebAssemblyTable>(args[0]))
    {
        JavascriptError::ThrowTypeError(scriptContext, WASMERR_NeedTableObject);
    }
    WebAssemblyTable * table = VarTo<WebAssemblyTable>(args[0]);

    Var indexVar = scriptContext->GetLibrary()->GetUndefined();
    if (args.Info.Count >= 2)
    {
        indexVar = args[1];
    }
    uint32 index = WebAssembly::ToNonWrappingUint32(indexVar, scriptContext);
    if (index >= table->m_currentLength)
    {
        JavascriptError::ThrowRangeError(scriptContext, JSERR_ArgumentOutOfRange);
    }
    if (!table->m_values[index])
    {
        return scriptContext->GetLibrary()->GetNull();
    }

    return CrossSite::MarshalVar(scriptContext, table->m_values[index]);
}